

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Transmitter_PDU::GetAntennaPattern(Transmitter_PDU *this,KOCTET *AP,KUINT16 Length)

{
  bool bVar1;
  KException *this_00;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  const_iterator citrEnd;
  const_iterator citr;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  KOCTET *pKStack_18;
  KUINT16 Length_local;
  KOCTET *AP_local;
  Transmitter_PDU *this_local;
  
  local_1a = Length;
  pKStack_18 = AP;
  AP_local = (KOCTET *)this;
  if (Length < this->m_ui16AntennaPatternLength) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GetAntennaPattern",&local_41);
    KException::KException(this_00,&local_40,1);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  citrEnd = std::vector<char,_std::allocator<char>_>::begin(&this->m_vAntennaPattern);
  local_68._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end(&this->m_vAntennaPattern);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_68);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&citrEnd);
    *pKStack_18 = *pcVar2;
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&citrEnd);
    pKStack_18 = pKStack_18 + 1;
  }
  return;
}

Assistant:

void Transmitter_PDU::GetAntennaPattern(KOCTET *AP, KUINT16 Length) const noexcept(false)
{
    if( Length < m_ui16AntennaPatternLength )throw KException( __FUNCTION__, BUFFER_TOO_SMALL );

    vector<KOCTET>::const_iterator citr = m_vAntennaPattern.begin();
    vector<KOCTET>::const_iterator citrEnd = m_vAntennaPattern.end();
    for( ; citr != citrEnd; ++citr, ++AP )
    {
        *AP = *citr;
    }
}